

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.c
# Opt level: O0

ALLEGRO_BITMAP ** reserve_local_bitmap(char *name,BmpType bmp_type)

{
  ALLEGRO_USTR *pAVar1;
  uint in_ESI;
  undefined8 in_RDI;
  int i;
  int local_18;
  
  local_18 = num_global_bitmaps;
  while( true ) {
    if (0x7f < local_18) {
      fatal_error("bitmap limit reached");
      return (ALLEGRO_BITMAP **)0x0;
    }
    if (bitmaps[local_18].name == (ALLEGRO_USTR *)0x0) break;
    local_18 = local_18 + 1;
  }
  pAVar1 = (ALLEGRO_USTR *)al_ustr_new(in_RDI);
  bitmaps[local_18].name = pAVar1;
  return (ALLEGRO_BITMAP **)((long)local_18 * 0x18 + 0x117528 + (ulong)in_ESI * 8);
}

Assistant:

static ALLEGRO_BITMAP **reserve_local_bitmap(const char *name, BmpType bmp_type)
{
   int i;

   for (i = num_global_bitmaps; i < MAX_BITMAPS; i++) {
      if (!bitmaps[i].name) {
         bitmaps[i].name = al_ustr_new(name);
         return &bitmaps[i].bitmap[bmp_type];
      }
   }

   fatal_error("bitmap limit reached");
   return NULL;
}